

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

void __thiscall
FunctionNode::FunctionNode
          (FunctionNode *this,TypeNode *type,PointerNode *pointer,TokenNode *id,
          FormalListNode *parameters,VarDeclNode *local,StmtListNode *body)

{
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__FunctionNode_001248d0;
  this->type = type;
  this->pointer = pointer;
  this->id = id;
  this->parameters = parameters;
  this->local = local;
  this->body = body;
  return;
}

Assistant:

FunctionNode::FunctionNode(TypeNode *type, PointerNode *pointer, TokenNode *id, FormalListNode *parameters,
                           VarDeclNode *local, StmtListNode *body) {
    this->type = type;
    this->pointer = pointer;
    this->id = id;
    this->parameters = parameters;
    this->local = local;
    this->body = body;
}